

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

char * StringToUnicode(char *cc,int size)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  int local_1c;
  
  if (out.Count != 0) {
    out.Count = 0;
  }
  lVar5 = 0;
  iVar4 = 0;
  do {
    pbVar2 = (byte *)(cc + lVar5);
    local_1c = (int)lVar5;
    if (*pbVar2 == 0) goto LAB_0047c3d5;
    lVar5 = lVar5 + 1;
    iVar4 = iVar4 + (uint)(*pbVar2 >> 7) + 1;
  } while ((size < 1) || (local_1c + (1 - size) != 0));
  local_1c = (int)lVar5;
LAB_0047c3d5:
  pcVar3 = cc;
  if (iVar4 != local_1c) {
    TArray<char,_char>::Resize(&out,iVar4 + 1);
    out.Array[out.Count - 1] = '\0';
    bVar1 = *cc;
    pcVar3 = out.Array;
    if (bVar1 != 0) {
      pbVar2 = (byte *)(cc + 1);
      iVar4 = 0;
      do {
        utf8_encode((uint)bVar1,out.Array + iVar4,&local_1c);
        iVar4 = iVar4 + local_1c;
        bVar1 = *pbVar2;
        pbVar2 = pbVar2 + 1;
        pcVar3 = out.Array;
      } while (bVar1 != 0);
    }
  }
  return pcVar3;
}

Assistant:

static const char *StringToUnicode(const char *cc, int size = -1)
{
	int ch;
	const char *c = cc;
	int count = 0;
	int count1 = 0;
	out.Clear();
	while ((ch = (*c++) & 255))
	{
		count1++;
		if (ch >= 128)
		{
			if (ch < 0x800) count += 2;
			else count += 3;
			// The source cannot contain 4-byte chars.
		}
		else count++;
		if (count1 == size && size > 0) break;
	}
	if (count == count1) return cc;	// string is pure ASCII.
	// we need to convert
	out.Resize(count + 1);
	out.Last() = 0;
	c = cc;
	int i = 0;
	while ((ch = (*c++) & 255))
	{
		utf8_encode(ch, &out[i], &count1);
		i += count1;
	}
	return &out[0];
}